

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDie::getCallerFrame
          (DWARFDie *this,uint32_t *CallFile,uint32_t *CallLine,uint32_t *CallColumn,
          uint32_t *CallDiscriminator)

{
  uint64_t uVar1;
  Optional<llvm::DWARFFormValue> local_110;
  Optional<llvm::DWARFFormValue> local_d8;
  Optional<llvm::DWARFFormValue> local_a0;
  Optional<llvm::DWARFFormValue> local_68;
  uint32_t *local_30;
  uint32_t *CallDiscriminator_local;
  uint32_t *CallColumn_local;
  uint32_t *CallLine_local;
  uint32_t *CallFile_local;
  DWARFDie *this_local;
  
  local_30 = CallDiscriminator;
  CallDiscriminator_local = CallColumn;
  CallColumn_local = CallLine;
  CallLine_local = CallFile;
  CallFile_local = (uint32_t *)this;
  find(&local_68,this,DW_AT_call_file);
  uVar1 = dwarf::toUnsigned(&local_68,0);
  *CallLine_local = (uint32_t)uVar1;
  find(&local_a0,this,DW_AT_call_line);
  uVar1 = dwarf::toUnsigned(&local_a0,0);
  *CallColumn_local = (uint32_t)uVar1;
  find(&local_d8,this,DW_AT_call_column);
  uVar1 = dwarf::toUnsigned(&local_d8,0);
  *CallDiscriminator_local = (uint32_t)uVar1;
  find(&local_110,this,DW_AT_GNU_discriminator);
  uVar1 = dwarf::toUnsigned(&local_110,0);
  *local_30 = (uint32_t)uVar1;
  return;
}

Assistant:

void DWARFDie::getCallerFrame(uint32_t &CallFile, uint32_t &CallLine,
                              uint32_t &CallColumn,
                              uint32_t &CallDiscriminator) const {
  CallFile = toUnsigned(find(DW_AT_call_file), 0);
  CallLine = toUnsigned(find(DW_AT_call_line), 0);
  CallColumn = toUnsigned(find(DW_AT_call_column), 0);
  CallDiscriminator = toUnsigned(find(DW_AT_GNU_discriminator), 0);
}